

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileCollider.cpp
# Opt level: O2

bool __thiscall
solitaire::colliders::StockPileCollider::uncoveredCardsCollidesWith
          (StockPileCollider *this,Position *position)

{
  bool bVar1;
  uint extraout_var;
  int extraout_var_00;
  Position cardsPosition;
  Position local_18;
  
  (*(this->stockPile->super_Archiver)._vptr_Archiver[7])();
  if ((extraout_var & 1) == 0) {
    bVar1 = false;
  }
  else {
    local_18.x = (*(this->super_StockPileCollider)._vptr_StockPileCollider[5])();
    local_18.y = extraout_var_00;
    bVar1 = cardCollidesWith(this,&local_18,position);
  }
  return bVar1;
}

Assistant:

bool StockPileCollider::uncoveredCardsCollidesWith(const Position& position) const {
    if (not stockPile.getSelectedCardIndex()) return false;
    const auto cardsPosition = getUncoveredCardsPosition();
    return cardCollidesWith(cardsPosition, position);
}